

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  Bytef BVar1;
  ushort uVar2;
  ushort uVar3;
  ulg uVar4;
  uint uVar5;
  int iVar6;
  ushort uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ushort uVar15;
  
  if (-1 < max_code) {
    uVar2 = (tree->dl).dad;
    uVar5 = 7;
    if (uVar2 == 0) {
      uVar5 = 0x8a;
    }
    iVar6 = (uVar2 != 0) + 3;
    uVar12 = 0;
    uVar9 = 0xffffffff;
    iVar14 = 0;
    uVar10 = (uint)uVar2;
    do {
      uVar13 = (ulong)uVar10;
      uVar2 = tree[uVar12 + 1].dl.dad;
      uVar11 = (uint)uVar2;
      iVar8 = iVar14 + 1;
      if (((int)uVar5 <= iVar8) || (uVar10 != uVar11)) {
        if (iVar8 < iVar6) {
          do {
            uVar7 = s->bl_tree[uVar13].dl.dad;
            iVar6 = s->bi_valid;
            uVar3 = s->bl_tree[uVar13].fc.freq;
            uVar15 = uVar3 << ((byte)iVar6 & 0x1f);
            if ((int)(0x10 - (uint)uVar7) < iVar6) {
              uVar15 = uVar15 | s->bi_buf;
              s->bi_buf = uVar15;
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = (Bytef)uVar15;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = BVar1;
              s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
              iVar6 = (uint)uVar7 + s->bi_valid + -0x10;
            }
            else {
              s->bi_buf = s->bi_buf | uVar15;
              iVar6 = iVar6 + (uint)uVar7;
            }
            s->bi_valid = iVar6;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        else {
          if (uVar10 == 0) {
            if (iVar14 < 10) {
              uVar7 = s->bl_tree[0x11].dl.dad;
              iVar6 = s->bi_valid;
              uVar3 = s->bl_tree[0x11].fc.freq;
              uVar15 = uVar3 << ((byte)iVar6 & 0x1f);
              if ((int)(0x10 - (uint)uVar7) < iVar6) {
                uVar15 = uVar15 | s->bi_buf;
                s->bi_buf = uVar15;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar15;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
                iVar6 = s->bi_valid + (uint)uVar7 + -0x10;
              }
              else {
                s->bi_buf = s->bi_buf | uVar15;
                iVar6 = iVar6 + (uint)uVar7;
              }
              s->bi_valid = iVar6;
              uVar5 = iVar14 + 0xfffe;
              if (iVar6 < 0xe) {
                s->bi_buf = s->bi_buf | (ushort)(uVar5 << ((byte)iVar6 & 0x1f));
                iVar6 = iVar6 + 3;
              }
              else {
                uVar7 = (ushort)(uVar5 << ((byte)iVar6 & 0x1f)) | s->bi_buf;
                s->bi_buf = uVar7;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar7;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = (ush)((uVar5 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
                iVar6 = s->bi_valid + -0xd;
              }
            }
            else {
              uVar7 = s->bl_tree[0x12].dl.dad;
              iVar6 = s->bi_valid;
              uVar3 = s->bl_tree[0x12].fc.freq;
              uVar15 = uVar3 << ((byte)iVar6 & 0x1f);
              if ((int)(0x10 - (uint)uVar7) < iVar6) {
                uVar15 = uVar15 | s->bi_buf;
                s->bi_buf = uVar15;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar15;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
                iVar6 = s->bi_valid + (uint)uVar7 + -0x10;
              }
              else {
                s->bi_buf = s->bi_buf | uVar15;
                iVar6 = iVar6 + (uint)uVar7;
              }
              s->bi_valid = iVar6;
              uVar5 = iVar14 + 0xfff6;
              if (iVar6 < 10) {
                s->bi_buf = s->bi_buf | (ushort)(uVar5 << ((byte)iVar6 & 0x1f));
                iVar6 = iVar6 + 7;
              }
              else {
                uVar7 = (ushort)(uVar5 << ((byte)iVar6 & 0x1f)) | s->bi_buf;
                s->bi_buf = uVar7;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar7;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = (ush)((uVar5 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
                iVar6 = s->bi_valid + -9;
              }
            }
          }
          else {
            if (uVar10 != (uint)uVar9) {
              uVar7 = s->bl_tree[uVar13].dl.dad;
              iVar6 = s->bi_valid;
              uVar3 = s->bl_tree[uVar13].fc.freq;
              uVar15 = uVar3 << ((byte)iVar6 & 0x1f);
              if ((int)(0x10 - (uint)uVar7) < iVar6) {
                uVar15 = uVar15 | s->bi_buf;
                s->bi_buf = uVar15;
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = (Bytef)uVar15;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar4 = s->pending;
                s->pending = uVar4 + 1;
                s->pending_buf[uVar4] = BVar1;
                s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
                iVar6 = (uint)uVar7 + s->bi_valid + -0x10;
              }
              else {
                s->bi_buf = s->bi_buf | uVar15;
                iVar6 = iVar6 + (uint)uVar7;
              }
              s->bi_valid = iVar6;
              iVar8 = iVar14;
            }
            uVar7 = s->bl_tree[0x10].dl.dad;
            iVar6 = s->bi_valid;
            uVar3 = s->bl_tree[0x10].fc.freq;
            uVar15 = uVar3 << ((byte)iVar6 & 0x1f);
            if ((int)(0x10 - (uint)uVar7) < iVar6) {
              uVar15 = uVar15 | s->bi_buf;
              s->bi_buf = uVar15;
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = (Bytef)uVar15;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = BVar1;
              s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
              iVar6 = s->bi_valid + (uint)uVar7 + -0x10;
            }
            else {
              s->bi_buf = s->bi_buf | uVar15;
              iVar6 = iVar6 + (uint)uVar7;
            }
            s->bi_valid = iVar6;
            uVar5 = iVar8 + 0xfffd;
            if (iVar6 < 0xf) {
              s->bi_buf = s->bi_buf | (ushort)(uVar5 << ((byte)iVar6 & 0x1f));
              iVar6 = iVar6 + 2;
            }
            else {
              uVar7 = (ushort)(uVar5 << ((byte)iVar6 & 0x1f)) | s->bi_buf;
              s->bi_buf = uVar7;
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = (Bytef)uVar7;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar4 = s->pending;
              s->pending = uVar4 + 1;
              s->pending_buf[uVar4] = BVar1;
              s->bi_buf = (ush)((uVar5 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
              iVar6 = s->bi_valid + -0xe;
            }
          }
          s->bi_valid = iVar6;
        }
        uVar9 = uVar13;
        iVar8 = 0;
        if (uVar2 == 0) {
          uVar5 = 0x8a;
          iVar6 = 3;
        }
        else {
          iVar6 = 4 - (uint)(uVar10 == uVar11);
          uVar5 = uVar10 == uVar11 ^ 7;
        }
      }
      iVar14 = iVar8;
      uVar12 = uVar12 + 1;
      uVar10 = uVar11;
    } while (uVar12 != max_code + 1);
  }
  return;
}

Assistant:

local void send_tree (s, tree, max_code)
    deflate_state *s;
    ct_data *tree; /* the tree to be scanned */
    int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(s, curlen, s->bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree); send_bits(s, count-3, 2);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree); send_bits(s, count-3, 3);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree); send_bits(s, count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}